

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bandpre.c
# Opt level: O0

int CVBandPrecSolve(sunrealtype t,N_Vector y,N_Vector fy,N_Vector r,N_Vector z,sunrealtype gamma,
                   sunrealtype delta,int lr,void *bp_data)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_R9;
  int retval;
  CVBandPrecData pdata;
  
  iVar1 = SUNLinSolSolve(0,*(undefined8 *)(in_R9 + 0x28),*(undefined8 *)(in_R9 + 0x20),in_RCX,in_RDX
                        );
  return iVar1;
}

Assistant:

static int CVBandPrecSolve(SUNDIALS_MAYBE_UNUSED sunrealtype t,
                           SUNDIALS_MAYBE_UNUSED N_Vector y,
                           SUNDIALS_MAYBE_UNUSED N_Vector fy, N_Vector r,
                           N_Vector z, SUNDIALS_MAYBE_UNUSED sunrealtype gamma,
                           SUNDIALS_MAYBE_UNUSED sunrealtype delta,
                           SUNDIALS_MAYBE_UNUSED int lr, void* bp_data)
{
  CVBandPrecData pdata;
  int retval;

  /* Assume matrix and lpivots have already been allocated. */
  pdata = (CVBandPrecData)bp_data;

  /* Call banded solver object to do the work */
  retval = SUNLinSolSolve(pdata->LS, pdata->savedP, z, r, ZERO);
  return (retval);
}